

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::_::CidrRange>::setCapacity(Vector<kj::_::CidrRange> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::_::CidrRange> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<kj::_::CidrRange> newBuilder;
  size_t newSize_local;
  Vector<kj::_::CidrRange> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<kj::_::CidrRange>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::_::CidrRange>::truncate(&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<kj::_::CidrRange>
            ((ArrayBuilder<kj::_::CidrRange> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<kj::_::CidrRange>>(&this->builder);
  ArrayBuilder<kj::_::CidrRange>::addAll<kj::ArrayBuilder<kj::_::CidrRange>>
            ((ArrayBuilder<kj::_::CidrRange> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::_::CidrRange>>((ArrayBuilder<kj::_::CidrRange> *)local_38);
  ArrayBuilder<kj::_::CidrRange>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::_::CidrRange>::~ArrayBuilder((ArrayBuilder<kj::_::CidrRange> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }